

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QMimeMagicRule>::copyAppend
          (QGenericArrayOps<QMimeMagicRule> *this,QMimeMagicRule *b,QMimeMagicRule *e)

{
  QMimeMagicRule *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  MatchFunction MVar4;
  int iVar5;
  quint32 qVar6;
  long lVar7;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QMimeMagicRule>).ptr;
    lVar7 = (this->super_QArrayDataPointer<QMimeMagicRule>).size;
    do {
      pDVar2 = (b->m_subMatches).d.d;
      pQVar1[lVar7].m_subMatches.d.d = pDVar2;
      pQVar1[lVar7].m_subMatches.d.ptr = (b->m_subMatches).d.ptr;
      pQVar1[lVar7].m_subMatches.d.size = (b->m_subMatches).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pQVar1[lVar7].m_type = b->m_type;
      pDVar3 = (b->m_value).d.d;
      pQVar1[lVar7].m_value.d.d = pDVar3;
      pQVar1[lVar7].m_value.d.ptr = (b->m_value).d.ptr;
      pQVar1[lVar7].m_value.d.size = (b->m_value).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar5 = b->m_endPos;
      pQVar1[lVar7].m_startPos = b->m_startPos;
      pQVar1[lVar7].m_endPos = iVar5;
      pDVar3 = (b->m_mask).d.d;
      pQVar1[lVar7].m_mask.d.d = pDVar3;
      pQVar1[lVar7].m_mask.d.ptr = (b->m_mask).d.ptr;
      pQVar1[lVar7].m_mask.d.size = (b->m_mask).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar3 = (b->m_pattern).d.d;
      pQVar1[lVar7].m_pattern.d.d = pDVar3;
      pQVar1[lVar7].m_pattern.d.ptr = (b->m_pattern).d.ptr;
      pQVar1[lVar7].m_pattern.d.size = (b->m_pattern).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(undefined8 *)&pQVar1[lVar7].field_0x80 = *(undefined8 *)&b->field_0x80;
      qVar6 = b->m_numberMask;
      MVar4 = b->m_matchFunction;
      pQVar1[lVar7].m_number = b->m_number;
      pQVar1[lVar7].m_numberMask = qVar6;
      pQVar1[lVar7].m_matchFunction = MVar4;
      b = b + 1;
      lVar7 = (this->super_QArrayDataPointer<QMimeMagicRule>).size + 1;
      (this->super_QArrayDataPointer<QMimeMagicRule>).size = lVar7;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }